

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

DbPage * sqlite3PagerLookup(Pager *pPager,Pgno pgno)

{
  sqlite3_pcache_page *psVar1;
  Pgno in_ESI;
  PCache *in_RDI;
  sqlite3_pcache_page *pPage;
  sqlite3_pcache_page *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  psVar1 = sqlite3PcacheFetch(in_RDI,in_ESI,in_stack_ffffffffffffffe8);
  if (psVar1 == (sqlite3_pcache_page *)0x0) {
    local_8 = (PgHdr *)0x0;
  }
  else {
    local_8 = sqlite3PcacheFetchFinish
                        ((PCache *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         (Pgno)((ulong)psVar1 >> 0x20),in_stack_ffffffffffffffd8);
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE DbPage *sqlite3PagerLookup(Pager *pPager, Pgno pgno){
  sqlite3_pcache_page *pPage;
  assert( pPager!=0 );
  assert( pgno!=0 );
  assert( pPager->pPCache!=0 );
  pPage = sqlite3PcacheFetch(pPager->pPCache, pgno, 0);
  assert( pPage==0 || pPager->hasHeldSharedLock );
  if( pPage==0 ) return 0;
  return sqlite3PcacheFetchFinish(pPager->pPCache, pgno, pPage);
}